

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::pid_formatter<spdlog::details::scoped_padder>::format
          (pid_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *param_3,
          memory_buf_t *dest)

{
  scoped_padder p;
  uint field_size;
  uint32_t pid;
  scoped_padder *in_stack_ffffffffffffffa0;
  memory_buf_t *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  scoped_padder *in_stack_ffffffffffffffc0;
  memory_buf_t *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd4;
  
  details::os::pid();
  fmt_helper::count_digits<unsigned_int>(0);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  fmt_helper::append_int<unsigned_int>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  scoped_padder::~scoped_padder(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = fmt_helper::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }